

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::DelayedSequenceElementSyntax::setChild
          (DelayedSequenceElementSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  SequenceExprSyntax *local_178;
  SelectorSyntax *local_170;
  ExpressionSyntax *local_168;
  string local_140;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  SequenceExprSyntax *local_68;
  SequenceExprSyntax *local_60;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  DelayedSequenceElementSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->doubleHash).kind = (undefined2)local_28;
    (this->doubleHash).field_0x2 = local_28._2_1_;
    (this->doubleHash).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->doubleHash).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->doubleHash).info = local_20;
    break;
  case 1:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_168 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_168 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    this->delayVal = local_168;
    break;
  case 2:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->openBracket).kind = (undefined2)local_38;
    (this->openBracket).field_0x2 = local_38._2_1_;
    (this->openBracket).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->openBracket).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->openBracket).info = local_30;
    break;
  case 3:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar2._0_8_;
    (this->op).kind = (undefined2)local_48;
    (this->op).field_0x2 = local_48._2_1_;
    (this->op).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->op).rawLen = local_48._4_4_;
    local_40 = TVar2.info;
    (this->op).info = local_40;
    break;
  case 4:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_170 = (SelectorSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_170 = SyntaxNode::as<slang::syntax::SelectorSyntax>(pSVar1);
    }
    this->range = local_170;
    break;
  case 5:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar2._0_8_;
    (this->closeBracket).kind = (undefined2)local_58;
    (this->closeBracket).field_0x2 = local_58._2_1_;
    (this->closeBracket).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->closeBracket).rawLen = local_58._4_4_;
    local_50 = TVar2.info;
    (this->closeBracket).info = local_50;
    break;
  case 6:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_178 = (SequenceExprSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_178 = SyntaxNode::as<slang::syntax::SequenceExprSyntax>(pSVar1);
    }
    local_68 = local_178;
    not_null<slang::syntax::SequenceExprSyntax*>::not_null<slang::syntax::SequenceExprSyntax*,void>
              ((not_null<slang::syntax::SequenceExprSyntax*> *)&local_60,&local_68);
    (this->expr).ptr = local_60;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_109);
    std::operator+(&local_e8,&local_108,":");
    std::__cxx11::to_string(&local_140,0x1099);
    std::operator+(&local_c8,&local_e8,&local_140);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(&local_88,&local_a8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_88);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void DelayedSequenceElementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: doubleHash = child.token(); return;
        case 1: delayVal = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 2: openBracket = child.token(); return;
        case 3: op = child.token(); return;
        case 4: range = child.node() ? &child.node()->as<SelectorSyntax>() : nullptr; return;
        case 5: closeBracket = child.token(); return;
        case 6: expr = child.node() ? &child.node()->as<SequenceExprSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}